

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

int __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
::SetAtFirstFreeSpot
          (List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
           *this,RecyclerWeakReference<Js::ScriptFunctionType> **item)

{
  RecyclerWeakReference<Js::ScriptFunctionType> *ptr;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_> **ppWVar1;
  int indexToSetAt;
  RecyclerWeakReference<Js::ScriptFunctionType> **item_local;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *this_local;
  
  this_local._4_4_ =
       Js::
       WeakRefFreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
       ::GetFreeItemIndex(&this->removePolicy,this);
  if (this_local._4_4_ == -1) {
    this_local._4_4_ = Add(this,item);
  }
  else {
    ptr = *item;
    ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)
                         &(this->
                          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                          ).buffer);
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_>::operator=
              (*ppWVar1 + this_local._4_4_,ptr);
  }
  return this_local._4_4_;
}

Assistant:

int SetAtFirstFreeSpot(const T& item)
        {
            int indexToSetAt = removePolicy.GetFreeItemIndex(this);

            if (indexToSetAt == -1)
            {
                return Add(item);
            }

            this->buffer[indexToSetAt] = item;
            return indexToSetAt;
        }